

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcard_mt.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
xcardMT::LinearSearch_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,xcardMT *this)

{
  char **__endptr;
  undefined4 uVar1;
  char *__nptr;
  pointer pbVar2;
  undefined8 uVar3;
  undefined1 *puVar4;
  size_type *psVar5;
  _Alloc_hider _Var6;
  longlong lVar7;
  int iVar8;
  int *piVar9;
  long lVar10;
  ulong uVar11;
  undefined8 uVar12;
  int iVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__s;
  ulong uVar14;
  long lVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar16;
  undefined8 *puVar17;
  void *__s_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e0;
  long local_d8;
  undefined1 *local_d0;
  undefined8 *local_c8;
  undefined1 *local_c0;
  size_type *local_b8;
  string max_search;
  size_type *local_78;
  string cardbuf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *final_result;
  longlong card_b;
  
  local_78 = &cardbuf._M_string_length;
  cardbuf._M_dataplus._M_p = (pointer)0x0;
  cardbuf._M_string_length._0_1_ = 0;
  __nptr = (this->super_xcard).prefix._M_dataplus._M_p;
  vStack_110.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x10565a;
  piVar9 = __errno_location();
  iVar13 = *piVar9;
  *piVar9 = 0;
  vStack_110.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x10567c;
  lVar10 = strtoll(__nptr,(char **)&local_b8,10);
  card_b = (longlong)piVar9;
  if (local_b8 == (size_type *)__nptr) {
    vStack_110.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x105aae;
    std::__throw_invalid_argument("stoll");
  }
  else {
    if (*piVar9 == 0) {
LAB_001056a3:
      *piVar9 = iVar13;
    }
    else if (*piVar9 == 0x22) {
      vStack_110.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1056a3;
      lVar10 = std::__throw_out_of_range("stoll");
      goto LAB_001056a3;
    }
    if (-1 < lVar10) {
      vStack_110.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1056c0;
      std::__cxx11::string::replace
                ((ulong)&local_78,0,(char *)0x0,(ulong)(this->super_xcard).prefix._M_dataplus._M_p);
    }
    _Var6._M_p = cardbuf._M_dataplus._M_p;
    local_b8 = &max_search._M_string_length;
    vStack_110.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1056e3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,local_78,(long)local_78 + cardbuf._M_dataplus._M_p);
    if ((int)_Var6._M_p < 0x10) {
      iVar8 = 0x10 - (int)_Var6._M_p;
      iVar13 = 1;
      if (1 < iVar8) {
        iVar13 = iVar8;
      }
      do {
        vStack_110.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x10572a;
        std::__cxx11::string::replace
                  ((ulong)&local_b8,(ulong)max_search._M_dataplus._M_p,(char *)0x0,0x107175);
        vStack_110.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x105741;
        std::__cxx11::string::replace
                  ((ulong)&local_78,(ulong)cardbuf._M_dataplus._M_p,(char *)0x0,0x107177);
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
    }
    lVar7 = card_b;
    psVar5 = local_b8;
    uVar1 = *(undefined4 *)card_b;
    *(undefined4 *)card_b = 0;
    __endptr = (char **)((long)&max_search.field_2 + 8);
    vStack_110.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x105773;
    cardbuf.field_2._8_8_ = strtoll((char *)local_b8,__endptr,10);
    if ((size_type *)max_search.field_2._8_8_ != psVar5) {
      if (*(int *)lVar7 == 0) {
LAB_0010579a:
        *(undefined4 *)lVar7 = uVar1;
      }
      else if (*(int *)lVar7 == 0x22) {
        vStack_110.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x10579a;
        std::__throw_out_of_range("stoll");
        goto LAB_0010579a;
      }
      psVar5 = local_78;
      uVar1 = *(undefined4 *)lVar7;
      *(undefined4 *)lVar7 = 0;
      vStack_110.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1057be;
      final_result = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)strtoll((char *)local_78,__endptr,10);
      if ((size_type *)max_search.field_2._8_8_ != psVar5) {
        if (*(int *)lVar7 != 0) {
          if (*(int *)lVar7 != 0x22) goto LAB_001057e5;
          vStack_110.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1057e1;
          final_result = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)std::__throw_out_of_range("stoll");
        }
        *(undefined4 *)lVar7 = uVar1;
LAB_001057e5:
        if (this->max_threads < 1) {
          vStack_110.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1057f5;
          iVar13 = std::thread::hardware_concurrency();
          this->max_threads = iVar13;
        }
        local_c0 = (undefined1 *)&local_f8;
        uVar11 = (ulong)(uint)this->max_threads;
        lVar10 = -(uVar11 * 0x18 + 0xf & 0xfffffffffffffff0);
        __s = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_f8 + lVar10);
        if (this->max_threads != 0) {
          *(undefined8 *)((long)&vStack_110 + lVar10 + 0x10) = 0x105856;
          memset(__s,0,((uVar11 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
        }
        (__return_storage_ptr__->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        lVar15 = cardbuf.field_2._8_8_ - (long)final_result;
        local_c8 = (undefined8 *)((long)&local_f8 + lVar10 + 8);
        local_d0 = (undefined1 *)__s;
        do {
          card_b = lVar15 / (long)this->max_threads;
          if (card_b <= this->max_threads) {
            this->max_threads = 1;
            card_b = lVar15;
          }
          local_d8 = lVar15;
          uVar14 = (ulong)(uint)this->max_threads;
          __s_00 = (void *)((long)local_d0 - (uVar14 * 8 + 0xf & 0xfffffffffffffff0));
          if (uVar14 != 0) {
            *(undefined8 *)((long)__s_00 + -8) = 0x1058e8;
            memset(__s_00,0,uVar14 * 8);
          }
          if ((long)final_result < (long)cardbuf.field_2._8_8_ && 0 < this->max_threads) {
            lVar15 = 1;
            pvVar16 = __s;
            do {
              max_search.field_2._8_8_ = runnerLS;
              local_f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)this;
              local_f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)final_result;
              local_e0 = pvVar16;
              final_result = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&((pointer)final_result)->_M_dataplus)->_M_impl).
                                        super__Vector_impl_data._M_start + card_b);
              *(undefined8 *)((long)__s_00 + -8) = 0x105975;
              std::thread::
              thread<void(xcardMT::*)(long_long,long_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*),xcardMT*,long_long,long_long&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>*,void>
                        ((thread *)&local_f8,
                         (offset_in_xcardMT_to_subr *)(max_search.field_2._M_local_buf + 8),
                         (xcardMT **)
                         &local_f8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                         (longlong *)
                         &local_f8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (longlong *)&final_result,&local_e0);
              if (*(long *)((long)__s_00 + lVar15 * 8 + -8) != 0) goto LAB_00105b80;
              *(pointer *)((long)__s_00 + lVar15 * 8 + -8) =
                   local_f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              if (this->max_threads <= lVar15) break;
              lVar15 = lVar15 + 1;
              pvVar16 = pvVar16 + 1;
            } while ((long)final_result < (long)cardbuf.field_2._8_8_);
          }
          iVar13 = this->max_threads;
          if (0 < iVar13) {
            lVar15 = 0;
            puVar17 = local_c8;
            do {
              *(undefined8 *)((long)__s_00 + -8) = 0x1059c8;
              std::thread::join();
              pbVar2 = (__return_storage_ptr__->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              uVar12 = puVar17[-1];
              uVar3 = *puVar17;
              *(undefined8 *)((long)__s_00 + -8) = 0x1059de;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         __return_storage_ptr__,pbVar2,uVar12,uVar3);
              lVar15 = lVar15 + 1;
              iVar13 = this->max_threads;
              puVar17 = puVar17 + 3;
            } while (lVar15 < iVar13);
          }
          puVar4 = local_d0;
          if (uVar14 != 0) {
            lVar15 = uVar14 << 3;
            do {
              if (*(long *)((long)__s_00 + lVar15 + -8) != 0) {
LAB_00105b80:
                *(undefined8 *)((long)__s_00 + -8) = 0x105b85;
                std::terminate();
              }
              lVar15 = lVar15 + -8;
            } while (lVar15 != 0);
          }
          lVar15 = local_d8 - card_b * iVar13;
          if (lVar15 == 0) {
            if (uVar11 != 0) {
              lVar15 = uVar11 * 0x18;
              do {
                *(undefined8 *)(puVar4 + -8) = 0x105a58;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&vStack_110 + lVar15 + lVar10));
                lVar15 = lVar15 + -0x18;
              } while (lVar15 != 0);
            }
            psVar5 = local_b8;
            puVar4 = local_c0;
            if (local_b8 != &max_search._M_string_length) {
              *(undefined8 *)(local_c0 + -8) = 0x105a7d;
              operator_delete(psVar5);
            }
            psVar5 = local_78;
            if (local_78 != &cardbuf._M_string_length) {
              *(undefined8 *)(puVar4 + -8) = 0x105a8f;
              operator_delete(psVar5);
            }
            return __return_storage_ptr__;
          }
        } while( true );
      }
      goto LAB_00105aba;
    }
  }
  vStack_110.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x105aba;
  std::__throw_invalid_argument("stoll");
LAB_00105aba:
  vStack_110.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x105ac6;
  uVar12 = std::__throw_invalid_argument("stoll");
  if (local_78 != &cardbuf._M_string_length) {
    vStack_110.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x105b78;
    operator_delete(local_78);
  }
  vStack_110.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x105b80;
  _Unwind_Resume(uVar12);
}

Assistant:

std::vector<std::string> xcardMT::LinearSearch()
{

    std::string cardbuf;

    if (std::stoll(this->prefix) > -1)
    {
        cardbuf.insert(0, this->prefix);
    }

    int initial_length = cardbuf.length();
    int zreq = 16 - initial_length;

    std::string max_search = cardbuf;

    for (int i = 0; i < zreq; i++)
    {
        max_search.insert(max_search.length(), "9");
        cardbuf.insert(cardbuf.length(), "0");
    }

    //convert to long long int
    long long int max_s = std::stoll(max_search);
    long long int card_b = std::stoll(cardbuf);

    //init. threads and results vector.
    if (this->max_threads <= 0){
        this->max_threads = std::thread::hardware_concurrency();
    }

    std::vector<std::string> results[this->max_threads];
    std::vector<std::string> final_result;

    long int remaining = max_s - card_b;

    while (true){
        long int per_thread = remaining / this->max_threads;

        if (per_thread <= this->max_threads){
            per_thread = remaining;
            this->max_threads = 1;
        }

        std::thread threads[this->max_threads];

        //dispatch
        for (int i = 0; i < this->max_threads && card_b < max_s; i++)
        {
            card_b += per_thread;
            threads[i] = std::thread(&xcardMT::runnerLS, this, card_b-per_thread, card_b, &results[i]);
        }
        

        //join
        for (int i = 0; i < this->max_threads; i++)
        {
            threads[i].join();
            final_result.insert(final_result.end(), results[i].begin(), results[i].end());
        }
        
        remaining -= per_thread * this->max_threads;
        if (remaining == 0){
            break;
        }

    }

    return final_result;
}